

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

string * __thiscall AmpIO::ExplainSiFault_abi_cxx11_(string *__return_storage_ptr__,AmpIO *this)

{
  bool bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  uint local_240;
  uint32_t amp_fault;
  uint i;
  uint32_t status;
  char *amp_fault_text [16];
  stringstream ss;
  ostream local_1a8 [399];
  allocator<char> local_19;
  AmpIO *local_18;
  AmpIO *this_local;
  
  local_18 = this;
  this_local = (AmpIO *)__return_storage_ptr__;
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar2 == 0x64524131) {
    std::__cxx11::stringstream::stringstream((stringstream *)(amp_fault_text + 0xf));
    amp_fault_text[0xd] = "Undefined";
    amp_fault_text[0xe] = "Undefined";
    amp_fault_text[0xb] = "Undefined";
    amp_fault_text[0xc] = "Undefined";
    amp_fault_text[9] = "Undefined";
    amp_fault_text[10] = "Undefined";
    amp_fault_text[7] = "Undefined";
    amp_fault_text[8] = "Undefined";
    amp_fault_text[5] = "Undefined";
    amp_fault_text[6] = "Undefined";
    amp_fault_text[3] = "HW overtemp";
    amp_fault_text[4] = "Undefined";
    amp_fault_text[1] = "Current deviation";
    amp_fault_text[2] = "HW overcurrent";
    _i = "-";
    amp_fault_text[0] = "ADC saturated";
    uVar2 = GetStatus(this);
    poVar3 = std::operator<<(local_1a8,"Explaining faults in the Si controller:");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(local_1a8,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(local_1a8,"1. Interlocks that are preventing the axis from turning on:"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    if ((uVar2 & 1) == 0) {
      poVar3 = std::operator<<(local_1a8,
                               "ESPM->dVRK communication failed. Robot not programmed? Cables?");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    if (((uVar2 & 1) != 0) && ((uVar2 & 2) == 0)) {
      poVar3 = std::operator<<(local_1a8,
                               "ESII/CC->ESPM communication failed. The problem is inside the robot."
                              );
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    if ((uVar2 & 8) == 0) {
      poVar3 = std::operator<<(local_1a8,
                               "Encoder preload is out of sync. You must preload encoder at least once."
                              );
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = GetPowerStatus(this,0);
    if (!bVar1) {
      poVar3 = std::operator<<(local_1a8,"48V bad. E-stop pressed?");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = GetWatchdogTimeoutStatus(this);
    if (bVar1) {
      poVar3 = std::operator<<(local_1a8,"Watchdog timeout.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    poVar3 = std::operator<<(local_1a8,"(end)");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(local_1a8,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(local_1a8,"2. Amps that are in fault state:");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    for (local_240 = 0; local_240 < this->NumMotors; local_240 = local_240 + 1) {
      uVar2 = GetAmpFaultCode(this,local_240);
      if (uVar2 != 0) {
        poVar3 = std::operator<<(local_1a8,"Amp ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_240);
        poVar3 = std::operator<<(poVar3,": ");
        poVar3 = std::operator<<(poVar3,*(char **)(&i + (ulong)uVar2 * 2));
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
    poVar3 = std::operator<<(local_1a8,"(end)");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(local_1a8,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(local_1a8,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)(amp_fault_text + 0xf));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Not a Si controller",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AmpIO::ExplainSiFault() const
{
    if (GetHardwareVersion() != dRA1_String) {
        return "Not a Si controller";
    }
    std::stringstream ss;
    const char* amp_fault_text[16] = {"-", "ADC saturated", "Current deviation", "HW overcurrent", "HW overtemp", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined"};
    uint32_t status = GetStatus();
    ss << "Explaining faults in the Si controller:" << std::endl;
    ss << std::endl;
    ss << "1. Interlocks that are preventing the axis from turning on:" << std::endl;
    if (!(status & (1 << 0))) ss << "ESPM->dVRK communication failed. Robot not programmed? Cables?" << std::endl;
    if ((status & (1 << 0)) && !(status & (1 << 1))) ss << "ESII/CC->ESPM communication failed. The problem is inside the robot." << std::endl;
    if (!(status & (1 << 3))) ss << "Encoder preload is out of sync. You must preload encoder at least once." << std::endl;
    if (!GetPowerStatus()) ss << "48V bad. E-stop pressed?" << std::endl;
    if (GetWatchdogTimeoutStatus()) ss << "Watchdog timeout." << std::endl;
    ss << "(end)" << std::endl;
    ss << std::endl;
    ss << "2. Amps that are in fault state:" << std::endl;
    for (unsigned int i = 0; i < NumMotors; i++) {
        // std::cout << NumMotors << std::endl;
        uint32_t amp_fault = GetAmpFaultCode(i);
        // std::cout << amp_fault << std::endl;
        if (amp_fault) {
            ss << "Amp " << i << ": " << amp_fault_text[amp_fault] << std::endl;
        }
    }
    ss << "(end)" << std::endl;
    ss << std::endl;
    ss << std::endl;
    return ss.str();
}